

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSimpleTypeErr
               (xmlSchemaAbstractCtxtPtr actxt,xmlParserErrors error,xmlNodePtr node,xmlChar *value,
               xmlSchemaTypePtr type,int displayValue)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *add;
  xmlChar *qName;
  xmlChar *str;
  xmlChar *msg;
  xmlSchemaTypePtr pxStack_30;
  int displayValue_local;
  xmlSchemaTypePtr type_local;
  xmlChar *value_local;
  xmlNodePtr node_local;
  xmlSchemaAbstractCtxtPtr pxStack_10;
  xmlParserErrors error_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  str = (xmlChar *)0x0;
  msg._4_4_ = displayValue;
  pxStack_30 = type;
  type_local = (xmlSchemaTypePtr)value;
  value_local = (xmlChar *)node;
  node_local._4_4_ = error;
  pxStack_10 = actxt;
  xmlSchemaFormatNodeForError(&str,actxt,node);
  if ((msg._4_4_ == 0) &&
     (iVar1 = xmlSchemaEvalErrorNodeType(pxStack_10,(xmlNodePtr)value_local), iVar1 != 2)) {
    str = xmlStrcat(str,(xmlChar *)"The character content is not a valid value of ");
  }
  else {
    str = xmlStrcat(str,(xmlChar *)"\'%s\' is not a valid value of ");
  }
  iVar1 = xmlSchemaIsGlobalItem(pxStack_30);
  if (iVar1 == 0) {
    str = xmlStrcat(str,(xmlChar *)"the local ");
  }
  else {
    str = xmlStrcat(str,(xmlChar *)"the ");
  }
  if ((pxStack_30->flags & 0x100U) == 0) {
    if ((pxStack_30->flags & 0x40U) == 0) {
      if ((pxStack_30->flags & 0x80U) != 0) {
        str = xmlStrcat(str,"union type");
      }
    }
    else {
      str = xmlStrcat(str,"list type");
    }
  }
  else {
    str = xmlStrcat(str,(xmlChar *)"atomic type");
  }
  iVar1 = xmlSchemaIsGlobalItem(pxStack_30);
  if (iVar1 != 0) {
    qName = (xmlChar *)0x0;
    str = xmlStrcat(str," \'");
    if (pxStack_30->builtInType == 0) {
      pxVar2 = xmlSchemaFormatQName(&qName,pxStack_30->targetNamespace,pxStack_30->name);
      if (qName == (xmlChar *)0x0) {
        qName = xmlStrdup(pxVar2);
      }
    }
    else {
      str = xmlStrcat(str,"xs:");
      qName = xmlStrdup(pxStack_30->name);
    }
    pxVar2 = str;
    add = xmlEscapeFormatString(&qName);
    str = xmlStrcat(pxVar2,add);
    str = xmlStrcat(str,"\'");
    if (qName != (xmlChar *)0x0) {
      (*xmlFree)(qName);
      qName = (xmlChar *)0x0;
    }
  }
  str = xmlStrcat(str,".\n");
  if ((msg._4_4_ == 0) &&
     (iVar1 = xmlSchemaEvalErrorNodeType(pxStack_10,(xmlNodePtr)value_local), iVar1 != 2)) {
    xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)str,(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else {
    xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)str,
                 (xmlChar *)type_local,(xmlChar *)0x0);
  }
  if (str != (xmlChar *)0x0) {
    (*xmlFree)(str);
  }
  return;
}

Assistant:

static void
xmlSchemaSimpleTypeErr(xmlSchemaAbstractCtxtPtr actxt,
		       xmlParserErrors error,
		       xmlNodePtr node,
		       const xmlChar *value,
		       xmlSchemaTypePtr type,
		       int displayValue)
{
    xmlChar *msg = NULL;

    xmlSchemaFormatNodeForError(&msg, actxt, node);

    if (displayValue || (xmlSchemaEvalErrorNodeType(actxt, node) ==
	    XML_ATTRIBUTE_NODE))
	msg = xmlStrcat(msg, BAD_CAST "'%s' is not a valid value of ");
    else
	msg = xmlStrcat(msg, BAD_CAST "The character content is not a valid "
	    "value of ");

    if (! xmlSchemaIsGlobalItem(type))
	msg = xmlStrcat(msg, BAD_CAST "the local ");
    else
	msg = xmlStrcat(msg, BAD_CAST "the ");

    if (WXS_IS_ATOMIC(type))
	msg = xmlStrcat(msg, BAD_CAST "atomic type");
    else if (WXS_IS_LIST(type))
	msg = xmlStrcat(msg, BAD_CAST "list type");
    else if (WXS_IS_UNION(type))
	msg = xmlStrcat(msg, BAD_CAST "union type");

    if (xmlSchemaIsGlobalItem(type)) {
	xmlChar *str = NULL;
	msg = xmlStrcat(msg, BAD_CAST " '");
	if (type->builtInType != 0) {
	    msg = xmlStrcat(msg, BAD_CAST "xs:");
	    str = xmlStrdup(type->name);
	} else {
	    const xmlChar *qName = xmlSchemaFormatQName(&str, type->targetNamespace, type->name);
	    if (!str)
		str = xmlStrdup(qName);
	}
	msg = xmlStrcat(msg, xmlEscapeFormatString(&str));
	msg = xmlStrcat(msg, BAD_CAST "'");
	FREE_AND_NULL(str);
    }
    msg = xmlStrcat(msg, BAD_CAST ".\n");
    if (displayValue || (xmlSchemaEvalErrorNodeType(actxt, node) ==
	    XML_ATTRIBUTE_NODE))
	xmlSchemaErr(actxt, error, node, (const char *) msg, value, NULL);
    else
	xmlSchemaErr(actxt, error, node, (const char *) msg, NULL, NULL);
    FREE_AND_NULL(msg)
}